

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

ly_module_imp_clb ly_ctx_get_module_imp_clb(ly_ctx *ctx,void **user_data)

{
  void **user_data_local;
  ly_ctx *ctx_local;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_get_module_imp_clb")
    ;
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    if (user_data != (void **)0x0) {
      *user_data = ctx->imp_clb_data;
    }
    ctx_local = (ly_ctx *)ctx->imp_clb;
  }
  return (ly_module_imp_clb)ctx_local;
}

Assistant:

API ly_module_imp_clb
ly_ctx_get_module_imp_clb(const struct ly_ctx *ctx, void **user_data)
{
    if (!ctx) {
        LOGARG;
        return NULL;
    }

    if (user_data) {
        *user_data = ctx->imp_clb_data;
    }
    return ctx->imp_clb;
}